

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddhcal.cpp
# Opt level: O3

int __thiscall
icu_63::BuddhistCalendar::clone
          (BuddhistCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  GregorianCalendar *this_00;
  
  this_00 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  if (this_00 != (GregorianCalendar *)0x0) {
    GregorianCalendar::GregorianCalendar(this_00,&this->super_GregorianCalendar);
    (this_00->super_Calendar).super_UObject._vptr_UObject =
         (_func_int **)&PTR__BuddhistCalendar_003ed540;
  }
  return (int)this_00;
}

Assistant:

Calendar* BuddhistCalendar::clone(void) const
{
    return new BuddhistCalendar(*this);
}